

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O1

void __thiscall
rlottie::Animation::setValue(undefined8 param_1,Animation *this,Property param_3,string *param_4)

{
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  undefined1 local_28 [32];
  code *local_8;
  
  uStack_40 = 0;
  local_28._4_4_ = Size;
  local_8 = std::
            _Function_handler<rlottie::Size_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:402:34)>
            ::_M_invoke;
  local_28._16_8_ = 0;
  local_28._24_8_ =
       std::
       _Function_handler<rlottie::Size_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:402:34)>
       ::_M_manager;
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48 = param_1;
  local_28._0_4_ = param_3;
  local_28._8_8_ = param_1;
  if (param_4->_M_string_length != 0) {
    internal::renderer::Composition::setValue
              ((Composition *)
               (((this->d)._M_t.
                 super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
                 super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
                 super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl)->mRenderer)._M_t,
               param_4,(LOTVariant *)local_28);
  }
  LOTVariant::Destroy((LOTVariant *)local_28);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

void Animation::setValue(Size_Type, Property prop, const std::string &keypath,
                         Size value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}